

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O0

void ymf278b_C_w(YMF278BChip *chip,UINT8 reg,UINT8 data)

{
  int iVar1;
  YMF278BSlot *slot_00;
  INT8 IVar2;
  uint uVar3;
  UINT32 UVar4;
  byte *pbVar5;
  UINT32 local_44;
  int local_34;
  int i;
  UINT8 *buf;
  UINT32 base;
  UINT8 wavetblhdr;
  YMF278BSlot *slot;
  int snum;
  UINT8 data_local;
  UINT8 reg_local;
  YMF278BChip *chip_local;
  
  slot._6_1_ = data;
  if ((reg < 8) || (0xf7 < reg)) {
    if ((1 < reg) && (reg != '\x02')) {
      if (reg == '\x03') {
        slot._6_1_ = data & 0x3f;
      }
      else if (reg != '\x04') {
        if (reg == '\x05') {
          chip->memadr = (uint)chip->regs[3] << 0x10 | (uint)chip->regs[4] << 8 | (uint)data;
        }
        else if (reg == '\x06') {
          if ((chip->regs[2] & 1) != 0) {
            ymf278b_writeMem(chip,chip->memadr,data);
            chip->memadr = chip->memadr + 1;
          }
        }
        else if (reg == 0xf8) {
          chip->fm_l = data & 7;
          chip->fm_r = (int)(uint)data >> 3 & 7;
          refresh_opl3_volume(chip);
        }
        else if (reg == 0xf9) {
          chip->pcm_l = data & 7;
          chip->pcm_r = (int)(uint)data >> 3 & 7;
        }
      }
    }
  }
  else {
    iVar1 = (int)(reg - 8) >> 0x1f;
    iVar1 = (reg - 8) + (((uint)((int)(reg - 8) / 6 + iVar1) >> 2) - iVar1) * -0x18;
    slot_00 = chip->slots + iVar1;
    switch((int)(reg - 8) / 0x18) {
    case 0:
      slot_00->wave = slot_00->wave & 0x100 | (ushort)data;
      uVar3 = (int)(uint)chip->regs[2] >> 2;
      if ((slot_00->wave < 0x180) || ((uVar3 & 7) == 0)) {
        local_44 = (uint)slot_00->wave * 0xc;
      }
      else {
        local_44 = (uint)((byte)uVar3 & 7) * 0x80000 + (slot_00->wave - 0x180) * 0xc;
      }
      pbVar5 = ymf278b_getMemPtr(chip,local_44);
      if (pbVar5 == (byte *)0x0) {
        slot_00->bits = 0xff;
      }
      else {
        slot_00->bits = (UINT8)((int)(*pbVar5 & 0xc0) >> 6);
        slot_00->startaddr = (uint)CONCAT11(pbVar5[1],pbVar5[2]) | (*pbVar5 & 0x3f) << 0x10;
        slot_00->loopaddr = CONCAT11(pbVar5[3],pbVar5[4]);
        slot_00->endaddr = CONCAT11(pbVar5[5],pbVar5[6]);
        for (local_34 = 7; local_34 < 0xc; local_34 = local_34 + 1) {
          ymf278b_C_w(chip,(char)iVar1 + '\b' + ((char)local_34 + -2) * '\x18',pbVar5[local_34]);
        }
        if (slot_00->keyon == '\0') {
          slot_00->stepptr = 0;
          slot_00->pos = 0;
        }
        else {
          ymf278b_keyOnHelper(chip,slot_00);
        }
      }
      break;
    case 1:
      slot_00->wave = slot_00->wave & 0xff | (data & 1) << 8;
      slot_00->FN = slot_00->FN & 0x380 | (ushort)((int)(uint)data >> 1);
      UVar4 = calcStep(slot_00->OCT,slot_00->FN,0);
      slot_00->step = UVar4;
      break;
    case 2:
      slot_00->FN = slot_00->FN & 0x7f | (data & 7) << 7;
      slot_00->PRVB = (UINT8)((int)(data & 8) >> 3);
      IVar2 = sign_extend_4((UINT8)((int)(data & 0xf0) >> 4));
      slot_00->OCT = IVar2;
      UVar4 = calcStep(slot_00->OCT,slot_00->FN,0);
      slot_00->step = UVar4;
      break;
    case 3:
      slot_00->TLdest = (UINT8)((int)(uint)data >> 1);
      if (slot_00->TLdest == '\x7f') {
        slot_00->TLdest = 0xff;
      }
      slot_00->LD = data & 1;
      if (slot_00->LD != '\0') {
        slot_00->TL = slot_00->TLdest;
      }
      break;
    case 4:
      if ((data & 0x10) == 0) {
        slot_00->pan = data & 0xf;
      }
      else {
        slot_00->pan = '\b';
      }
      if ((data & 0x20) == 0) {
        slot_00->lfo_active = '\x01';
      }
      else {
        slot_00->lfo_active = '\0';
        slot_00->lfo_cnt = 0;
      }
      slot_00->DAMP = (UINT8)((int)(data & 0x40) >> 6);
      if ((data & 0x80) == 0) {
        if (slot_00->keyon != '\0') {
          slot_00->keyon = '\0';
          slot_00->state = '\x01';
        }
      }
      else if (slot_00->keyon == '\0') {
        slot_00->keyon = '\x01';
        ymf278b_keyOnHelper(chip,slot_00);
      }
      break;
    case 5:
      slot_00->lfo = (byte)((int)(uint)data >> 3) & 7;
      slot_00->vib = data & 7;
      break;
    case 6:
      slot_00->AR = (UINT8)((int)(uint)data >> 4);
      slot_00->D1R = data & 0xf;
      break;
    case 7:
      slot_00->DL = dl_tab[(int)(uint)data >> 4];
      slot_00->D2R = data & 0xf;
      break;
    case 8:
      slot_00->RC = (UINT8)((int)(uint)data >> 4);
      slot_00->RR = data & 0xf;
      break;
    case 9:
      slot_00->AM = data & 7;
    }
  }
  chip->regs[reg] = slot._6_1_;
  return;
}

Assistant:

static void ymf278b_C_w(YMF278BChip* chip, UINT8 reg, UINT8 data)
{
	// Handle slot registers specifically
	if (reg >= 0x08 && reg <= 0xF7)
	{
		int snum = (reg - 8) % 24;
		YMF278BSlot* slot = &chip->slots[snum];
		UINT8 wavetblhdr;
		UINT32 base;
		UINT8* buf;
		int i;
		
		switch((reg - 8) / 24)
		{
		case 0:
			slot->wave = (slot->wave & 0x100) | data;
			wavetblhdr = (chip->regs[2] >> 2) & 0x7;
			base = (slot->wave < 384 || ! wavetblhdr) ?
			       (slot->wave * 12) :
			       (wavetblhdr * 0x80000 + ((slot->wave - 384) * 12));
			// TODO What if R#2 bit 0 = 1?
			//      See also getSample()
			buf = ymf278b_getMemPtr(chip, base);
			if (buf == NULL)
			{
				slot->bits = ~0;	// set invalid value to mute the sample
				break;
			}
			
			slot->bits = (buf[0] & 0xC0) >> 6;
			slot->startaddr = buf[2] | (buf[1] << 8) | ((buf[0] & 0x3F) << 16);
			slot->loopaddr = buf[4] | (buf[3] << 8);
			slot->endaddr  = buf[6] | (buf[5] << 8);
			for (i = 7; i < 12; ++i)
			{
				// Verified on real YMF278:
				// After tone loading, if you read these
				// registers, their value actually has changed.
				ymf278b_C_w(chip, 8 + snum + (i - 2) * 24, buf[i]);
			}
			
			if (slot->keyon) {
				ymf278b_keyOnHelper(chip, slot);
			} else {
				slot->stepptr = 0;
				slot->pos = 0;
			}
			break;
		case 1:
			slot->wave = (slot->wave & 0xFF) | ((data & 0x1) << 8);
			slot->FN = (slot->FN & 0x380) | (data >> 1);
			slot->step = calcStep(slot->OCT, slot->FN, 0);
			break;
		case 2:
			slot->FN = (slot->FN & 0x07F) | ((data & 0x07) << 7);
			slot->PRVB = ((data & 0x08) >> 3);
			slot->OCT =  sign_extend_4((data & 0xF0) >> 4);
			slot->step = calcStep(slot->OCT, slot->FN, 0);
			break;
		case 3:
			slot->TLdest = data >> 1;
			if (slot->TLdest == 0x7F)
				slot->TLdest = 0xFF;	// verified on HW via volume interpolation
			slot->LD = data & 0x1;

			if (slot->LD) {
				// directly change volume
				slot->TL = slot->TLdest;
			} else {
				// interpolate volume
			}
			break;
		case 4:
			if (data & 0x10)
			{
				// output to DO1 pin:
				// this pin is not used in moonsound
				// we emulate this by muting the sound
				slot->pan = 8; // both left/right -inf dB
			}
			else
				slot->pan = data & 0x0F;

			if (data & 0x20)
			{
				// LFO reset
				slot->lfo_active = 0;
				slot->lfo_cnt = 0;
			}
			else
			{
				// LFO activate
				slot->lfo_active = 1;
			}

			slot->DAMP = (data & 0x40) >> 6;
			if (data & 0x80)
			{
				if (! slot->keyon)
				{
					slot->keyon = 1;
					ymf278b_keyOnHelper(chip, slot);
				}
			}
			else
			{
				if (slot->keyon)
				{
					slot->keyon = 0;
					slot->state = EG_REL;
				}
			}
			break;
		case 5:
			slot->lfo = (data >> 3) & 0x7;
			slot->vib = data & 0x7;
			break;
		case 6:
			slot->AR  = data >> 4;
			slot->D1R = data & 0xF;
			break;
		case 7:
			slot->DL  = dl_tab[data >> 4];
			slot->D2R = data & 0xF;
			break;
		case 8:
			slot->RC = data >> 4;
			slot->RR = data & 0xF;
			break;
		case 9:
			slot->AM = data & 0x7;
			break;
		}
	}
	else
	{
		// All non-slot registers
		switch (reg)
		{
		case 0x00: // TEST
		case 0x01:
			break;

		case 0x02:
			// wave-table-header / memory-type / memory-access-mode
			// Simply store in regs[2]
			break;

		case 0x03:
			// Verified on real YMF278:
			// * Don't update the 'memadr' variable on writes to
			//   reg 3 and 4. Only store the value in the 'regs'
			//   array for later use.
			// * The upper 2 bits are not used to address the
			//   external memories (so from a HW pov they don't
			//   matter). But if you read back this register, the
			//   upper 2 bits always read as '0' (even if you wrote
			//   '1'). So we mask the bits here already.
			data &= 0x3F;
			break;

		case 0x04:
			// See reg 3.
			break;

		case 0x05:
			// Verified on real YMF278: (see above)
			// Only writes to reg 5 change the (full) 'memadr'.
			chip->memadr = (chip->regs[3] << 16) | (chip->regs[4] << 8) | data;
			break;

		case 0x06:  // memory data
			if (chip->regs[2] & 1) {
				ymf278b_writeMem(chip, chip->memadr, data);
				++chip->memadr; // no need to mask (again) here
			} else {
				// Verified on real YMF278:
				//  - writes are ignored
				//  - memadr is NOT increased
			}
			break;

		case 0xF8:
			chip->fm_l = data & 0x7;
			chip->fm_r = (data >> 3) & 0x7;
			refresh_opl3_volume(chip);
			break;

		case 0xF9:
			chip->pcm_l = data & 0x7;
			chip->pcm_r = (data >> 3) & 0x7;
			break;
		}
	}

	chip->regs[reg] = data;
}